

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O3

uint64_t __thiscall doublechecked::Roaring64Map::rank(Roaring64Map *this,uint64_t x)

{
  uint64_t uVar1;
  _Rb_tree_node_base *p_Var2;
  uint64_t uVar3;
  
  uVar1 = roaring::Roaring64Map::rank(&this->plain,x);
  uVar3 = 0;
  for (p_Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var2 != &(this->check)._M_t._M_impl.super__Rb_tree_header &&
      (*(ulong *)(p_Var2 + 1) <= x)); p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)
      ) {
    uVar3 = uVar3 + 1;
  }
  _assert_true((ulong)(uVar1 == uVar3),"ans == count",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
               ,0x1b0);
  return uVar1;
}

Assistant:

uint64_t rank(uint64_t x) const {
        uint64_t ans = plain.rank(x);

        uint64_t count = 0;
        auto it = check.begin();
        auto it_end = check.end();
        for (; it != it_end && *it <= x; ++it) ++count;
        assert_true(ans == count);

        return ans;
    }